

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getLeaveVals2(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *leaveMax,SPxId enterId,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *enterBound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newUBbound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newLBbound,
               number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *newCoPrhs,
               StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *objChange)

{
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  pointer pnVar11;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  type_conflict5 tVar22;
  int iVar23;
  Status SVar24;
  double *pdVar25;
  Status *pSVar26;
  ostream *poVar27;
  SPxInternalCodeException *pSVar28;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar29;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar30;
  int local_ac;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  SPxId enterId_local;
  cpp_dec_float<50U,_int,_void> local_68;
  
  this_00 = &this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  enterId_local = enterId;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&enterBound->m_backend,0);
  if (enterId.super_DataKey.info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&result,&enterId_local);
    iVar23 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&result);
    lVar30 = (long)iVar23;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.rowstat.data[lVar30]) {
    case D_FREE:
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68,&this->thePvec->thedelta,iVar23);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&local_68,&leaveMax->m_backend);
      local_ac = 0;
      tVar22 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend,&local_ac);
      pVVar29 = &this->theURbound;
      if (tVar22) {
        pVVar29 = &this->theLRbound;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(pVVar29->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      (newUBbound->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
      (newUBbound->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
      (newUBbound->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
      (newUBbound->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
      (newUBbound->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      (newUBbound->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
      (newUBbound->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
      (newUBbound->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
      (newUBbound->m_backend).exp = result.m_backend.exp;
      (newUBbound->m_backend).neg = result.m_backend.neg;
      (newUBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar25,(type *)0x0);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (newLBbound->m_backend).exp = result.m_backend.exp;
      (newLBbound->m_backend).neg = result.m_backend.neg;
      (newLBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      pSVar26 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data;
      goto LAB_00224868;
    case D_ON_UPPER:
      goto switchD_00223efd_caseD_2;
    case D_ON_LOWER:
switchD_00223efd_caseD_4:
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (newUBbound->m_backend).exp = result.m_backend.exp;
      (newUBbound->m_backend).neg = result.m_backend.neg;
      (newUBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar30] = P_ON_UPPER;
      v = &(this->theURbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      goto LAB_00224696;
    case D_ON_BOTH:
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68,&this->thePvec->thedelta,iVar23);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&leaveMax->m_backend,&local_68);
      local_ac = 0;
      tVar22 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend,&local_ac);
      if (!tVar22) goto switchD_00223efd_caseD_4;
      goto switchD_00223efd_caseD_2;
    case P_FIXED:
      poVar27 = std::operator<<((ostream *)&std::cerr,"ELEAVE54 ");
      poVar27 = std::operator<<(poVar27,"ERROR! Tried to put a fixed row variable into the basis: ")
      ;
      poVar27 = std::operator<<(poVar27,"idx=");
      poVar27 = (ostream *)std::ostream::operator<<((ostream *)poVar27,iVar23);
      poVar27 = std::operator<<(poVar27,", lhs=");
      poVar27 = boost::multiprecision::operator<<
                          (poVar27,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .left.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar30);
      poVar27 = std::operator<<(poVar27,", rhs=");
      poVar27 = boost::multiprecision::operator<<
                          (poVar27,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .right.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar30);
      std::endl<char,std::char_traits<char>>(poVar27);
      pSVar28 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XLEAVE05 This should never happen.",(allocator *)&local_68);
      SPxInternalCodeException::SPxInternalCodeException(pSVar28,(string *)&result);
      __cxa_throw(pSVar28,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      pSVar28 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XLEAVE06 This should never happen.",(allocator *)&local_68);
      SPxInternalCodeException::SPxInternalCodeException(pSVar28,(string *)&result);
      __cxa_throw(pSVar28,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar24 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualRowStatus(this_00,iVar23);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar30] = SVar24;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      tVar22 = boost::multiprecision::operator<
                         (pnVar11 + lVar30,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend);
      if (tVar22) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,
                   &(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(this->theURbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      iVar23 = pnVar11[lVar30].m_backend.exp;
      uVar5 = pnVar11[lVar30].m_backend.fpclass;
      uVar12 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      (newLBbound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar19;
      (newLBbound->m_backend).data._M_elems[9] = uVar4;
      (newLBbound->m_backend).exp = iVar23;
      (newLBbound->m_backend).neg = (bool)((uVar3 != 0 || uVar5 != 0) ^ bVar2);
      (newLBbound->m_backend).fpclass = uVar5;
      (newLBbound->m_backend).prec_elem = uVar12;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      uVar6 = pnVar11[lVar30].m_backend.fpclass;
      uVar13 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      iVar23 = pnVar11[lVar30].m_backend.exp;
      (newUBbound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar19;
      (newUBbound->m_backend).data._M_elems[9] = uVar4;
      (newUBbound->m_backend).exp = iVar23;
      (newUBbound->m_backend).neg = (bool)((uVar3 != 0 || uVar6 != 0) ^ bVar2);
      (newUBbound->m_backend).fpclass = uVar6;
      (newUBbound->m_backend).prec_elem = uVar13;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      iVar23 = pnVar11[lVar30].m_backend.exp;
      uVar7 = pnVar11[lVar30].m_backend.fpclass;
      uVar14 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      (enterBound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar19;
      (enterBound->m_backend).data._M_elems[9] = uVar4;
      (enterBound->m_backend).exp = iVar23;
      (enterBound->m_backend).neg = (bool)((uVar3 != 0 || uVar7 != 0) ^ bVar2);
      (enterBound->m_backend).fpclass = uVar7;
      (enterBound->m_backend).prec_elem = uVar14;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      SVar24 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualRowStatus(this_00,iVar23);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.rowstat.data[lVar30] = SVar24;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar25,(type *)0x0);
      tVar22 = boost::multiprecision::operator>
                         (pnVar11 + lVar30,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend);
      if (tVar22) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->theURbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,
                   &(this->theLRbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(this->theLRbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      iVar23 = pnVar11[lVar30].m_backend.exp;
      uVar8 = pnVar11[lVar30].m_backend.fpclass;
      uVar15 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      (newUBbound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 7) = uVar19;
      (newUBbound->m_backend).data._M_elems[9] = uVar4;
      (newUBbound->m_backend).exp = iVar23;
      (newUBbound->m_backend).neg = (bool)((uVar3 != 0 || uVar8 != 0) ^ bVar2);
      (newUBbound->m_backend).fpclass = uVar8;
      (newUBbound->m_backend).prec_elem = uVar15;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      uVar9 = pnVar11[lVar30].m_backend.fpclass;
      uVar16 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      iVar23 = pnVar11[lVar30].m_backend.exp;
      (newLBbound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 7) = uVar19;
      (newLBbound->m_backend).data._M_elems[9] = uVar4;
      (newLBbound->m_backend).exp = iVar23;
      (newLBbound->m_backend).neg = (bool)((uVar3 != 0 || uVar9 != 0) ^ bVar2);
      (newLBbound->m_backend).fpclass = uVar9;
      (newLBbound->m_backend).prec_elem = uVar16;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = pnVar11[lVar30].m_backend.data._M_elems[0];
      uVar4 = *(uint *)((long)&pnVar11[lVar30].m_backend.data + 0x24);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 0x14);
      uVar18 = *(undefined8 *)puVar1;
      uVar19 = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar11[lVar30].m_backend.data + 4);
      uVar20 = *(undefined8 *)puVar1;
      uVar21 = *(undefined8 *)(puVar1 + 2);
      iVar23 = pnVar11[lVar30].m_backend.exp;
      uVar10 = pnVar11[lVar30].m_backend.fpclass;
      uVar17 = pnVar11[lVar30].m_backend.prec_elem;
      bVar2 = pnVar11[lVar30].m_backend.neg;
      (enterBound->m_backend).data._M_elems[0] = uVar3;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 1) = uVar20;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 3) = uVar21;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 5) = uVar18;
      *(undefined8 *)((enterBound->m_backend).data._M_elems + 7) = uVar19;
      (enterBound->m_backend).data._M_elems[9] = uVar4;
      (enterBound->m_backend).exp = iVar23;
      (enterBound->m_backend).neg = (bool)((uVar3 != 0 || uVar10 != 0) ^ bVar2);
      (enterBound->m_backend).fpclass = uVar10;
      (enterBound->m_backend).prec_elem = uVar17;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .right.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      pSVar28 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XLEAVE04 This should never happen.",(allocator *)&local_68);
      SPxInternalCodeException::SPxInternalCodeException(pSVar28,(string *)&result);
      __cxa_throw(pSVar28,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&newCoPrhs->m_backend,
               (cpp_dec_float<50U,_int,_void> *)((long)pnVar11 + lVar30 * 0x38));
  }
  else {
    SPxColId::SPxColId((SPxColId *)&result,&enterId_local);
    iVar23 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
             ::number(&(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .
                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .set,(DataKey *)&result);
    lVar30 = (long)iVar23;
    switch((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.colstat.data[lVar30]) {
    case D_FREE:
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      (newUBbound->m_backend).data._M_elems[4] = result.m_backend.data._M_elems[4];
      (newUBbound->m_backend).data._M_elems[5] = result.m_backend.data._M_elems[5];
      (newUBbound->m_backend).data._M_elems[6] = result.m_backend.data._M_elems[6];
      (newUBbound->m_backend).data._M_elems[7] = result.m_backend.data._M_elems[7];
      (newUBbound->m_backend).data._M_elems[0] = result.m_backend.data._M_elems[0];
      (newUBbound->m_backend).data._M_elems[1] = result.m_backend.data._M_elems[1];
      (newUBbound->m_backend).data._M_elems[2] = result.m_backend.data._M_elems[2];
      (newUBbound->m_backend).data._M_elems[3] = result.m_backend.data._M_elems[3];
      (newUBbound->m_backend).exp = result.m_backend.exp;
      (newUBbound->m_backend).neg = result.m_backend.neg;
      (newUBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar25,(type *)0x0);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (newLBbound->m_backend).exp = result.m_backend.exp;
      (newLBbound->m_backend).neg = result.m_backend.neg;
      (newLBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pSVar26 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.colstat.data;
LAB_00224868:
      pSVar26[lVar30] = P_FIXED;
      return;
    case D_ON_LOWER:
switchD_00223e06_caseD_4:
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      *(ulong *)((newUBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((newUBbound->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(newUBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((newUBbound->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (newUBbound->m_backend).exp = result.m_backend.exp;
      (newUBbound->m_backend).neg = result.m_backend.neg;
      (newUBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newUBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,0);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar30] = P_ON_UPPER;
      v = &(this->theUCbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
      goto LAB_00224696;
    case D_ON_BOTH:
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68,&this->theCoPvec->thedelta,iVar23);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&leaveMax->m_backend,&local_68);
      local_ac = 0;
      tVar22 = boost::multiprecision::operator<
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend,&local_ac);
      if (!tVar22) goto switchD_00223e06_caseD_4;
    case D_ON_UPPER:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newUBbound->m_backend,0);
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar25,(type *)0x0);
      *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
           CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) =
           result.m_backend.data._M_elems._16_8_;
      *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
           CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
      *(undefined8 *)(newLBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
      *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) =
           result.m_backend.data._M_elems._8_8_;
      (newLBbound->m_backend).exp = result.m_backend.exp;
      (newLBbound->m_backend).neg = result.m_backend.neg;
      (newLBbound->m_backend).fpclass = result.m_backend.fpclass;
      (newLBbound->m_backend).prec_elem = result.m_backend.prec_elem;
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar30] = P_ON_LOWER;
      v = &(this->theLCbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
LAB_00224696:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,v);
      return;
    case P_FIXED:
      poVar27 = std::operator<<((ostream *)&std::cerr,"ELEAVE56 ");
      poVar27 = std::operator<<(poVar27,
                                "ERROR! Tried to put a fixed column variable into the basis. ");
      poVar27 = std::operator<<(poVar27,"idx=");
      poVar27 = (ostream *)std::ostream::operator<<((ostream *)poVar27,iVar23);
      poVar27 = std::operator<<(poVar27,", lower=");
      poVar27 = boost::multiprecision::operator<<
                          (poVar27,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .low.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar30);
      poVar27 = std::operator<<(poVar27,", upper=");
      poVar27 = boost::multiprecision::operator<<
                          (poVar27,(this->
                                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   ).
                                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .up.val.
                                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar30);
      std::endl<char,std::char_traits<char>>(poVar27);
      pSVar28 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XLEAVE07 This should never happen.",(allocator *)&local_68);
      SPxInternalCodeException::SPxInternalCodeException(pSVar28,(string *)&result);
      __cxa_throw(pSVar28,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    default:
      pSVar28 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&result,"XLEAVE08 This should never happen.",(allocator *)&local_68);
      SPxInternalCodeException::SPxInternalCodeException(pSVar28,(string *)&result);
      __cxa_throw(pSVar28,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_LOWER:
      SVar24 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar23);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar30] = SVar24;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,*pdVar25,(type *)0x0);
      tVar22 = boost::multiprecision::operator<
                         (pnVar11 + lVar30,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend);
      if (tVar22) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->theUCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,
                   &(this->theLCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(this->theLCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newUBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_ON_UPPER:
      SVar24 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar23);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar30] = SVar24;
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar25 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result.m_backend,-*pdVar25,(type *)0x0);
      tVar22 = boost::multiprecision::operator>
                         (pnVar11 + lVar30,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend);
      if (tVar22) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->theLCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend,
                   &(this->theUCbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(this->theUCbound).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newUBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      pnVar11 = (this->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .up.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      break;
    case P_FREE:
      SVar24 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::dualColStatus(this_00,iVar23);
      (this->
      super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thedesc.colstat.data[lVar30] = SVar24;
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_68,&this->thePvec->thedelta,iVar23);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&result.m_backend,&local_68,&leaveMax->m_backend);
      local_ac = 0;
      tVar22 = boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&result.m_backend,&local_ac);
      pVVar29 = &this->theLCbound;
      if (tVar22) {
        pVVar29 = &this->theUCbound;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newCoPrhs->m_backend,
                 &(pVVar29->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newUBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&newLBbound->m_backend,
                 &(this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&enterBound->m_backend,0);
      return;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&enterBound->m_backend,
               (cpp_dec_float<50U,_int,_void> *)((long)pnVar11 + lVar30 * 0x38));
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&newCoPrhs->m_backend,&enterBound->m_backend);
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
            ((cpp_dec_float<50U,_int,_void> *)objChange,&result.m_backend);
  return;
switchD_00223efd_caseD_2:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&newUBbound->m_backend,0);
  pdVar25 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&result.m_backend,-*pdVar25,(type *)0x0);
  *(ulong *)((newLBbound->m_backend).data._M_elems + 8) =
       CONCAT44(result.m_backend.data._M_elems[9],result.m_backend.data._M_elems[8]);
  *(undefined8 *)((newLBbound->m_backend).data._M_elems + 4) = result.m_backend.data._M_elems._16_8_
  ;
  *(ulong *)((newLBbound->m_backend).data._M_elems + 6) =
       CONCAT44(result.m_backend.data._M_elems[7],result.m_backend.data._M_elems[6]);
  *(undefined8 *)(newLBbound->m_backend).data._M_elems = result.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((newLBbound->m_backend).data._M_elems + 2) = result.m_backend.data._M_elems._8_8_;
  (newLBbound->m_backend).exp = result.m_backend.exp;
  (newLBbound->m_backend).neg = result.m_backend.neg;
  (newLBbound->m_backend).fpclass = result.m_backend.fpclass;
  (newLBbound->m_backend).prec_elem = result.m_backend.prec_elem;
  (this->
  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).thedesc.rowstat.data[lVar30] = P_ON_LOWER;
  v = &(this->theLRbound).val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
  goto LAB_00224696;
}

Assistant:

void SPxSolverBase<R>::getLeaveVals2(
   R leaveMax,
   SPxId enterId,
   R& enterBound,
   R& newUBbound,
   R& newLBbound,
   R& newCoPrhs,
   StableSum<R>& objChange
)
{
   typename SPxBasisBase<R>::Desc& ds = this->desc();

   enterBound = 0;

   if(enterId.isSPxRowId())
   {
      int idx = this->number(SPxRowId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.rowStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);

         if(thePvec->delta()[idx] * leaveMax < 0)
            newCoPrhs = theLRbound[idx];
         else
            newCoPrhs = theURbound[idx];

         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLRbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theURbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * thePvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLRbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.rowStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theURbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->lhs(idx) > R(-infinity))
            theURbound[idx] = theLRbound[idx];

         newCoPrhs = theLRbound[idx];        // slack !!
         newUBbound = -this->lhs(idx);
         newLBbound = -this->rhs(idx);
         enterBound = -this->rhs(idx);
         objChange -= newCoPrhs * this->rhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.rowStatus(idx) = this->dualRowStatus(idx);

         if(this->rhs(idx) < R(infinity))
            theLRbound[idx] = theURbound[idx];

         newCoPrhs = theURbound[idx];        // slack !!
         newLBbound = -this->rhs(idx);
         newUBbound = -this->lhs(idx);
         enterBound = -this->lhs(idx);
         objChange -= newCoPrhs * this->lhs(idx);
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
#if 1
         throw SPxInternalCodeException("XLEAVE04 This should never happen.");
#else
         SPX_MSG_ERROR(std::cerr << "ELEAVE53 ERROR: not yet debugged!" << std::endl;)
         ds.rowStatus(idx) = this->dualRowStatus(idx);
         newCoPrhs = theURbound[idx];        // slack !!
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         enterBound = 0;
#endif
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE54 "
                       << "ERROR! Tried to put a fixed row variable into the basis: "
                       << "idx="   << idx
                       << ", lhs=" << this->lhs(idx)
                       << ", rhs=" << this->rhs(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE05 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE06 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE55 SPxSolverBase<R>::getLeaveVals2(): row {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.rowStatus(idx), objChange);
   }

   else
   {
      assert(enterId.isSPxColId());
      int idx = this->number(SPxColId(enterId));
      typename SPxBasisBase<R>::Desc::Status enterStat = ds.colStatus(idx);

      // coverity[switch_selector_expr_is_constant]
      switch(enterStat)
      {
      case SPxBasisBase<R>::Desc::D_ON_UPPER :
         assert(rep() == ROW);
         newUBbound = 0;
         newLBbound = R(-infinity);
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
         newCoPrhs = theLCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_ON_LOWER :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = 0;
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         newCoPrhs = theUCbound[idx];
         break;

      case SPxBasisBase<R>::Desc::D_FREE :
         assert(rep() == ROW);
         newUBbound = R(infinity);
         newLBbound = R(-infinity);
         newCoPrhs = theLCbound[idx];
         ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_FIXED;
         break;

      case SPxBasisBase<R>::Desc::D_ON_BOTH :
         assert(rep() == ROW);

         if(leaveMax * theCoPvec->delta()[idx] < 0)
         {
            newUBbound = 0;
            newLBbound = R(-infinity);
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_LOWER;
            newCoPrhs = theLCbound[idx];
         }
         else
         {
            newUBbound = R(infinity);
            newLBbound = 0;
            ds.colStatus(idx) = SPxBasisBase<R>::Desc::P_ON_UPPER;
            newCoPrhs = theUCbound[idx];
         }

         break;

      case SPxBasisBase<R>::Desc::P_ON_UPPER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::lower(idx) > R(-infinity))
            theLCbound[idx] = theUCbound[idx];

         newCoPrhs = theUCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::upper(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_ON_LOWER :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(SPxLPBase<R>::upper(idx) < R(infinity))
            theUCbound[idx] = theLCbound[idx];

         newCoPrhs = theLCbound[idx];
         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = SPxLPBase<R>::lower(idx);
         objChange -= newCoPrhs * enterBound;
         break;

      case SPxBasisBase<R>::Desc::P_FREE :
         assert(rep() == COLUMN);
         ds.colStatus(idx) = this->dualColStatus(idx);

         if(thePvec->delta()[idx] * leaveMax > 0)
            newCoPrhs = theUCbound[idx];
         else
            newCoPrhs = theLCbound[idx];

         newUBbound = SPxLPBase<R>::upper(idx);
         newLBbound = SPxLPBase<R>::lower(idx);
         enterBound = 0;
         break;

      case SPxBasisBase<R>::Desc::P_FIXED :
         assert(rep() == COLUMN);
         SPX_MSG_ERROR(std::cerr << "ELEAVE56 "
                       << "ERROR! Tried to put a fixed column variable into the basis. "
                       << "idx="     << idx
                       << ", lower=" << this->lower(idx)
                       << ", upper=" << this->upper(idx) << std::endl;)
         throw SPxInternalCodeException("XLEAVE07 This should never happen.");

      default:
         throw SPxInternalCodeException("XLEAVE08 This should never happen.");
      }

      SPxOut::debug(this, "DLEAVE57 SPxSolverBase<R>::getLeaveVals2(): col {} : {} -> {} objChange: {}\n",
                    idx, enterStat, ds.colStatus(idx), objChange);
   }

}